

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

AssertionExpr *
slang::ast::CaseAssertionExpr::fromSyntax(CasePropertyExprSyntax *syntax,ASTContext *context)

{
  bool bVar1;
  int iVar2;
  reference ppPVar3;
  PropertyExprSyntax *pPVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  CaseAssertionExpr *pCVar5;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  undefined8 extraout_RDX;
  AssertionExpr **args_2;
  sockaddr *in_RSI;
  long in_RDI;
  iterator iVar6;
  ExpressionSyntax *es;
  iterator __end4;
  iterator __begin4;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *__range4;
  SmallVector<const_slang::ast::Expression_*,_5UL> exprs;
  AssertionExpr *body;
  StandardPropertyCaseItemSyntax *sci;
  PropertyCaseItemSyntax *item;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::PropertyCaseItemSyntax> *__range2;
  SmallVector<slang::ast::CaseAssertionExpr::ItemGroup,_4UL> items;
  AssertionExpr *defCase;
  Expression *expr;
  Compilation *comp;
  ItemGroup *in_stack_fffffffffffffdb8;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *in_stack_fffffffffffffdc0;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> *in_stack_fffffffffffffdc8;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_stack_fffffffffffffdd0;
  Expression *in_stack_fffffffffffffde8;
  BumpAllocator *in_stack_fffffffffffffdf0;
  undefined8 in_stack_fffffffffffffe08;
  ASTContext *in_stack_fffffffffffffe10;
  Expression *in_stack_fffffffffffffe18;
  AssertionExpr *local_188;
  ASTContext *local_180;
  not_null<const_slang::ast::AssertionExpr_*> local_160;
  Expression *local_158;
  ExpressionSyntax *local_150;
  iterator local_148;
  iterator local_138;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *local_128;
  SmallVectorBase<const_slang::ast::Expression_*> local_120 [2];
  AssertionExpr *local_e0;
  StandardPropertyCaseItemSyntax *local_c8;
  SyntaxNode *local_c0;
  PropertyCaseItemSyntax **local_b8;
  __normal_iterator<slang::syntax::PropertyCaseItemSyntax_**,_std::span<slang::syntax::PropertyCaseItemSyntax_*,_18446744073709551615UL>_>
  local_b0;
  long local_a8;
  SmallVectorBase<slang::ast::CaseAssertionExpr::ItemGroup> local_a0 [2];
  Expression *local_28;
  Expression *local_20;
  Compilation *local_18;
  sockaddr *local_10;
  long local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_18 = ASTContext::getCompilation((ASTContext *)0xb61f74);
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0xb61f8d);
  local_20 = bindExpr((ExpressionSyntax *)in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      SUB81((ulong)in_stack_fffffffffffffe08 >> 0x38,0),
                      SUB81((ulong)in_stack_fffffffffffffe08 >> 0x30,0));
  local_28 = (Expression *)0x0;
  SmallVector<slang::ast::CaseAssertionExpr::ItemGroup,_4UL>::SmallVector
            ((SmallVector<slang::ast::CaseAssertionExpr::ItemGroup,_4UL> *)0xb61fc2);
  local_a8 = local_8 + 0x50;
  local_b0._M_current =
       (PropertyCaseItemSyntax **)
       std::span<slang::syntax::PropertyCaseItemSyntax_*,_18446744073709551615UL>::begin
                 ((span<slang::syntax::PropertyCaseItemSyntax_*,_18446744073709551615UL> *)
                  in_stack_fffffffffffffdb8);
  local_b8 = (PropertyCaseItemSyntax **)
             std::span<slang::syntax::PropertyCaseItemSyntax_*,_18446744073709551615UL>::end
                       ((span<slang::syntax::PropertyCaseItemSyntax_*,_18446744073709551615UL> *)
                        in_stack_fffffffffffffdc8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<slang::syntax::PropertyCaseItemSyntax_**,_std::span<slang::syntax::PropertyCaseItemSyntax_*,_18446744073709551615UL>_>
                      ((__normal_iterator<slang::syntax::PropertyCaseItemSyntax_**,_std::span<slang::syntax::PropertyCaseItemSyntax_*,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffdc0,
                       (__normal_iterator<slang::syntax::PropertyCaseItemSyntax_**,_std::span<slang::syntax::PropertyCaseItemSyntax_*,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffdb8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppPVar3 = __gnu_cxx::
              __normal_iterator<slang::syntax::PropertyCaseItemSyntax_**,_std::span<slang::syntax::PropertyCaseItemSyntax_*,_18446744073709551615UL>_>
              ::operator*(&local_b0);
    local_c0 = &(*ppPVar3)->super_SyntaxNode;
    if (local_c0->kind == StandardPropertyCaseItem) {
      local_c8 = slang::syntax::SyntaxNode::as<slang::syntax::StandardPropertyCaseItemSyntax>
                           (local_c0);
      pPVar4 = not_null<slang::syntax::PropertyExprSyntax_*>::operator*
                         ((not_null<slang::syntax::PropertyExprSyntax_*> *)0xb6208c);
      iVar2 = AssertionExpr::bind((int)pPVar4,local_10,0);
      local_e0 = (AssertionExpr *)CONCAT44(extraout_var,iVar2);
      SmallVector<const_slang::ast::Expression_*,_5UL>::SmallVector
                ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0xb620d6);
      local_128 = &local_c8->expressions;
      iVar6 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::begin
                        ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)0xb620f7);
      local_138 = iVar6;
      iVar6 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::end
                        (in_stack_fffffffffffffdc0);
      local_148 = iVar6;
      while( true ) {
        bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>_>
                          ((self_type *)in_stack_fffffffffffffdc0,
                           (iterator_base<slang::syntax::ExpressionSyntax_*> *)
                           in_stack_fffffffffffffdb8);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        local_150 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_false>
                    ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_false>
                                 *)0xb62199);
        in_stack_fffffffffffffe18 =
             bindExpr((ExpressionSyntax *)in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      SUB81((ulong)in_stack_fffffffffffffe08 >> 0x38,0),
                      SUB81((ulong)in_stack_fffffffffffffe08 >> 0x30,0));
        local_158 = in_stack_fffffffffffffe18;
        SmallVectorBase<const_slang::ast::Expression_*>::push_back
                  ((SmallVectorBase<const_slang::ast::Expression_*> *)in_stack_fffffffffffffdc0,
                   (Expression **)in_stack_fffffffffffffdb8);
        iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_false>
        ::
        operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>_>
                  ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_false>
                    *)in_stack_fffffffffffffdc0);
      }
      iVar2 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                        (local_120,(EVP_PKEY_CTX *)local_18,src_00);
      in_stack_fffffffffffffe10 = (ASTContext *)CONCAT44(extraout_var_00,iVar2);
      in_stack_fffffffffffffe08 = extraout_RDX;
      local_180 = in_stack_fffffffffffffe10;
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
      span<const_slang::ast::Expression_*,_18446744073709551615UL>
                (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      local_188 = local_e0;
      not_null<const_slang::ast::AssertionExpr_*>::not_null<const_slang::ast::AssertionExpr_*>
                (&local_160,&local_188);
      SmallVectorBase<slang::ast::CaseAssertionExpr::ItemGroup>::push_back
                ((SmallVectorBase<slang::ast::CaseAssertionExpr::ItemGroup> *)
                 in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
      SmallVector<const_slang::ast::Expression_*,_5UL>::~SmallVector
                ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0xb622eb);
    }
    else if (local_28 == (Expression *)0x0) {
      slang::syntax::SyntaxNode::as<slang::syntax::DefaultPropertyCaseItemSyntax>(local_c0);
      in_stack_fffffffffffffdf0 =
           (BumpAllocator *)
           not_null<slang::syntax::PropertyExprSyntax_*>::operator*
                     ((not_null<slang::syntax::PropertyExprSyntax_*> *)0xb6231a);
      iVar2 = AssertionExpr::bind((int)in_stack_fffffffffffffdf0,local_10,0);
      in_stack_fffffffffffffde8 = (Expression *)CONCAT44(extraout_var_01,iVar2);
      local_28 = in_stack_fffffffffffffde8;
    }
    __gnu_cxx::
    __normal_iterator<slang::syntax::PropertyCaseItemSyntax_**,_std::span<slang::syntax::PropertyCaseItemSyntax_*,_18446744073709551615UL>_>
    ::operator++(&local_b0);
  }
  iVar2 = SmallVectorBase<slang::ast::CaseAssertionExpr::ItemGroup>::copy
                    (local_a0,(EVP_PKEY_CTX *)local_18,src);
  pCVar5 = BumpAllocator::
           emplace<slang::ast::CaseAssertionExpr,slang::ast::Expression_const&,std::span<slang::ast::CaseAssertionExpr::ItemGroup,18446744073709551615ul>,slang::ast::AssertionExpr_const*&>
                     (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                      (span<slang::ast::CaseAssertionExpr::ItemGroup,_18446744073709551615UL> *)
                      CONCAT44(extraout_var_02,iVar2),args_2);
  SmallVector<slang::ast::CaseAssertionExpr::ItemGroup,_4UL>::~SmallVector
            ((SmallVector<slang::ast::CaseAssertionExpr::ItemGroup,_4UL> *)0xb623e1);
  return &pCVar5->super_AssertionExpr;
}

Assistant:

AssertionExpr& CaseAssertionExpr::fromSyntax(const CasePropertyExprSyntax& syntax,
                                             const ASTContext& context) {
    auto& comp = context.getCompilation();
    auto& expr = bindExpr(*syntax.expr, context, /* allowInstances */ false, /* isBoolean */ false);

    const AssertionExpr* defCase = nullptr;
    SmallVector<ItemGroup, 4> items;
    for (auto item : syntax.items) {
        if (item->kind == SyntaxKind::StandardPropertyCaseItem) {
            auto& sci = item->as<StandardPropertyCaseItemSyntax>();
            auto& body = AssertionExpr::bind(*sci.expr, context);

            SmallVector<const Expression*> exprs;
            for (auto es : sci.expressions) {
                exprs.push_back(
                    &bindExpr(*es, context, /* allowInstances */ false, /* isBoolean */ false));
            }

            items.push_back(ItemGroup{exprs.copy(comp), &body});
        }
        else {
            // The parser already errored for duplicate defaults,
            // so just ignore if it happens here.
            if (!defCase) {
                defCase = &AssertionExpr::bind(*item->as<DefaultPropertyCaseItemSyntax>().expr,
                                               context);
            }
        }
    }

    return *comp.emplace<CaseAssertionExpr>(expr, items.copy(comp), defCase);
}